

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

uint32_t svb_select_avx_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint8_t *puVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  xmm_t PrevHi;
  xmm_t PrevLow;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint32_t local_3c;
  uint64_t local_38;
  
  iVar16 = 0;
  if (count < 0x20) goto LAB_0014a153;
  local_38 = count;
  puVar7 = keyPtr + 8;
  uVar6 = (uint32_t)puVar7;
  local_3c = prev;
  local_68 = vpbroadcastd_avx512vl();
  uVar14 = *(ulong *)keyPtr;
  if (count >> 5 == 1) {
    iVar16 = 0;
  }
  else {
    uVar13 = 1;
    uVar12 = uVar14;
    pauVar17 = (undefined1 (*) [16])dataPtr;
    iVar10 = 0;
    do {
      uVar14 = *(ulong *)(keyPtr + uVar13 * 8);
      if (uVar12 == 0) {
        auVar20 = vlddqu_avx(*pauVar17);
        auVar20 = vpmovzxbw_avx(auVar20);
        auVar21 = vpslldq_avx(auVar20,2);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar21 = vpslldq_avx(auVar20,4);
        auVar20 = vpaddd_avx(auVar20,auVar21);
        auVar21 = vpmovzxwd_avx(auVar20);
        auVar22._4_4_ = local_68._12_4_;
        auVar22._0_4_ = local_68._12_4_;
        auVar22._8_4_ = local_68._12_4_;
        auVar22._12_4_ = local_68._12_4_;
        local_58 = vpaddd_avx512vl(auVar21,auVar22);
        auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
        local_68 = vpaddd_avx(local_58,auVar20);
        iVar15 = slot - (iVar10 + 8);
        dataPtr = (uint8_t *)pauVar17;
        if (slot < iVar10 + 8) {
          local_78[0] = local_58;
          local_78[1] = local_68;
          lVar8 = (long)(slot - iVar10);
        }
        else {
          auVar20 = vlddqu_avx(*(undefined1 (*) [16])(*pauVar17 + 8));
          auVar20 = vpmovzxbw_avx(auVar20);
          auVar21 = vpslldq_avx(auVar20,2);
          auVar22 = vpshufd_avx(local_68,0xff);
          auVar20 = vpaddd_avx(auVar21,auVar20);
          auVar21 = vpslldq_avx(auVar20,4);
          auVar20 = vpaddd_avx(auVar20,auVar21);
          auVar21 = vpmovzxwd_avx(auVar20);
          local_58 = vpaddd_avx(auVar22,auVar21);
          auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
          local_68 = vpaddd_avx(local_58,auVar20);
          if (iVar10 + 0x10 <= slot) {
            auVar20 = vlddqu_avx(pauVar17[1]);
            auVar20 = vpmovzxbw_avx(auVar20);
            auVar21 = vpslldq_avx(auVar20,2);
            auVar22 = vpshufd_avx(local_68,0xff);
            auVar20 = vpaddd_avx(auVar21,auVar20);
            auVar21 = vpslldq_avx(auVar20,4);
            auVar20 = vpaddd_avx(auVar20,auVar21);
            auVar21 = vpmovzxwd_avx(auVar20);
            local_58 = vpaddd_avx(auVar22,auVar21);
            auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
            local_68 = vpaddd_avx(local_58,auVar20);
            iVar15 = slot - (iVar10 + 0x18);
            if (slot < iVar10 + 0x18) {
              local_78[0] = local_58;
              local_78[1] = local_68;
              lVar8 = (long)(slot - (iVar10 + 0x10));
              goto LAB_00149ded;
            }
            auVar20 = vlddqu_avx(*(undefined1 (*) [16])(pauVar17[1] + 8));
            auVar20 = vpmovzxbw_avx(auVar20);
            auVar21 = vpslldq_avx(auVar20,2);
            auVar22 = vpshufd_avx(local_68,0xff);
            auVar20 = vpaddd_avx(auVar21,auVar20);
            auVar21 = vpslldq_avx(auVar20,4);
            auVar20 = vpaddd_avx(auVar20,auVar21);
            auVar21 = vpmovzxwd_avx(auVar20);
            local_58 = vpaddd_avx(auVar22,auVar21);
            auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
            local_68 = vpaddd_avx(local_58,auVar20);
            iVar16 = iVar10 + 0x20;
            if (iVar16 <= slot) {
              dataPtr = (uint8_t *)(pauVar17 + 2);
              bVar4 = false;
              bVar5 = false;
              goto LAB_00149e1f;
            }
          }
LAB_00149dd7:
          local_78[0] = local_58;
          local_78[1] = local_68;
          lVar8 = (long)iVar15;
          dataPtr = (uint8_t *)pauVar17;
        }
LAB_00149ded:
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                               local_78[*(int *)(_extract_from_xmm_indices + lVar8 * 4)],
                              *(undefined1 (*) [16])
                               (streamvbyte_shuffle_mask_bytes + (((uint)lVar8 & 3) << 4)));
        puVar7 = (uint8_t *)(ulong)auVar20._0_4_;
        bVar4 = true;
        bVar5 = false;
        iVar16 = iVar10;
      }
      else {
        auVar20 = vpshufb_avx(*pauVar17,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar12 & 0xff) << 4)));
        auVar21 = vpslldq_avx(auVar20,4);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar21._4_4_ = local_68._12_4_;
        auVar21._0_4_ = local_68._12_4_;
        auVar21._8_4_ = local_68._12_4_;
        auVar21._12_4_ = local_68._12_4_;
        auVar21 = vpaddd_avx512vl(auVar20,auVar21);
        auVar20 = vpslldq_avx(auVar20,8);
        local_58 = vpaddd_avx(auVar21,auVar20);
        bVar9 = (byte)(uVar12 >> 8);
        dataPtr = *pauVar17 +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [bVar9] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar12 & 0xff];
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                               (*pauVar17 +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar12 & 0xff]),(undefined1  [16])shuffleTable[bVar9]);
        auVar22 = vpslldq_avx(auVar20,4);
        auVar21 = vpshufd_avx(local_58,0xff);
        auVar20 = vpaddd_avx(auVar22,auVar20);
        auVar22 = vpslldq_avx(auVar20,8);
        auVar20 = vpaddd_avx(auVar20,auVar22);
        local_68 = vpaddd_avx(auVar20,auVar21);
        iVar1 = iVar10 + 8;
        if (iVar1 <= slot) {
          uVar11 = (uint)uVar12 >> 0x10 & 0xff;
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])(shuffleTable[0] + (uVar11 << 4)));
          auVar22 = vpslldq_avx(auVar20,4);
          auVar21 = vpshufd_avx(local_68,0xff);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar20,auVar22);
          local_58 = vpaddd_avx(auVar20,auVar21);
          uVar18 = uVar12 >> 0x18 & 0xff;
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                 [uVar11]),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar18 << 4)));
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar18] +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar11];
          auVar22 = vpslldq_avx(auVar20,4);
          auVar21 = vpshufd_avx(local_58,0xff);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar20,auVar22);
          local_68 = vpaddd_avx(auVar20,auVar21);
          iVar15 = slot - (iVar10 + 0x10);
          if (iVar10 + 0x10 <= slot) {
            uVar18 = uVar12 >> 0x20 & 0xff;
            auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar18 << 4))
                                 );
            auVar22 = vpslldq_avx(auVar20,4);
            auVar21 = vpshufd_avx(local_68,0xff);
            auVar20 = vpaddd_avx(auVar22,auVar20);
            auVar22 = vpslldq_avx(auVar20,8);
            auVar20 = vpaddd_avx(auVar20,auVar22);
            local_58 = vpaddd_avx(auVar20,auVar21);
            uVar19 = uVar12 >> 0x28 & 0xff;
            auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar18]),
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar19 << 4))
                                 );
            pauVar17 = (undefined1 (*) [16])
                       (*(undefined1 (*) [16])dataPtr +
                       (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                              [uVar19] +
                       (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                              [uVar18]);
            auVar22 = vpslldq_avx(auVar20,4);
            auVar21 = vpshufd_avx(local_58,0xff);
            auVar20 = vpaddd_avx(auVar22,auVar20);
            auVar22 = vpslldq_avx(auVar20,8);
            auVar20 = vpaddd_avx(auVar20,auVar22);
            local_68 = vpaddd_avx(auVar20,auVar21);
            iVar1 = iVar10 + 0x18;
            if (slot < iVar1) goto LAB_00149dd7;
            uVar18 = uVar12 >> 0x30 & 0xff;
            auVar20 = vpshufb_avx(*pauVar17,
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar18 << 4))
                                 );
            auVar22 = vpslldq_avx(auVar20,4);
            auVar21 = vpshufd_avx(local_68,0xff);
            auVar20 = vpaddd_avx(auVar22,auVar20);
            auVar22 = vpslldq_avx(auVar20,8);
            auVar20 = vpaddd_avx(auVar20,auVar22);
            local_58 = vpaddd_avx(auVar20,auVar21);
            auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*pauVar17 +
                                   "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar18]),(undefined1  [16])shuffleTable[uVar12 >> 0x38]);
            dataPtr = *pauVar17 +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar12 >> 0x38] +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar18];
            auVar22 = vpslldq_avx(auVar20,4);
            auVar21 = vpshufd_avx(local_58,0xff);
            auVar20 = vpaddd_avx(auVar22,auVar20);
            auVar22 = vpslldq_avx(auVar20,8);
            auVar20 = vpaddd_avx(auVar20,auVar22);
            local_68 = vpaddd_avx(auVar20,auVar21);
            iVar16 = iVar10 + 0x20;
            if (iVar16 <= slot) {
              bVar4 = false;
              bVar5 = true;
              goto LAB_00149e1f;
            }
          }
          local_78[0] = local_58;
          local_78[1] = local_68;
          lVar8 = (long)(slot - iVar1);
          goto LAB_00149ded;
        }
        local_78[0] = local_58;
        local_78[1] = local_68;
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                               local_78[*(int *)(_extract_from_xmm_indices +
                                                (long)(slot - iVar10) * 4)],
                              *(undefined1 (*) [16])
                               (streamvbyte_shuffle_mask_bytes + ((slot - iVar10 & 3U) << 4)));
        puVar7 = (uint8_t *)(ulong)auVar20._0_4_;
        bVar4 = true;
        bVar5 = false;
        iVar16 = iVar10;
      }
LAB_00149e1f:
      uVar6 = (uint32_t)puVar7;
      if (bVar4) goto LAB_0014a14f;
      uVar13 = uVar13 + 1;
      uVar12 = uVar14;
      pauVar17 = (undefined1 (*) [16])dataPtr;
      iVar10 = iVar16;
    } while (count >> 5 != uVar13);
  }
  if (uVar14 == 0) {
    auVar20 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
    auVar20 = vpmovzxbw_avx(auVar20);
    auVar21 = vpslldq_avx(auVar20,2);
    auVar20 = vpaddd_avx(auVar21,auVar20);
    auVar21 = vpslldq_avx(auVar20,4);
    auVar20 = vpaddd_avx(auVar20,auVar21);
    auVar21 = vpmovzxwd_avx(auVar20);
    auVar3._4_4_ = local_68._12_4_;
    auVar3._0_4_ = local_68._12_4_;
    auVar3._8_4_ = local_68._12_4_;
    auVar3._12_4_ = local_68._12_4_;
    local_58 = vpaddd_avx512vl(auVar21,auVar3);
    auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
    local_68 = vpaddd_avx(local_58,auVar20);
    if (slot < iVar16 + 8) {
      local_78[0] = local_58;
      local_78[1] = local_68;
      lVar8 = (long)(slot - iVar16);
    }
    else {
      auVar20 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar20 = vpmovzxbw_avx(auVar20);
      auVar21 = vpslldq_avx(auVar20,2);
      auVar22 = vpshufd_avx(local_68,0xff);
      auVar20 = vpaddd_avx(auVar21,auVar20);
      auVar21 = vpslldq_avx(auVar20,4);
      auVar20 = vpaddd_avx(auVar20,auVar21);
      auVar21 = vpmovzxwd_avx(auVar20);
      local_58 = vpaddd_avx(auVar22,auVar21);
      auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
      local_68 = vpaddd_avx(local_58,auVar20);
      if (slot < iVar16 + 0x10) {
        local_78[0] = local_58;
        local_78[1] = local_68;
        lVar8 = (long)(slot - (iVar16 + 8));
      }
      else {
        auVar20 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar20 = vpmovzxbw_avx(auVar20);
        auVar21 = vpslldq_avx(auVar20,2);
        auVar22 = vpshufd_avx(local_68,0xff);
        auVar20 = vpaddd_avx(auVar21,auVar20);
        auVar21 = vpslldq_avx(auVar20,4);
        auVar20 = vpaddd_avx(auVar20,auVar21);
        auVar21 = vpmovzxwd_avx(auVar20);
        local_58 = vpaddd_avx(auVar22,auVar21);
        auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
        local_68 = vpaddd_avx(local_58,auVar20);
        uVar11 = slot - (iVar16 + 0x18);
        if (iVar16 + 0x18 <= slot) {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
          auVar20 = vpmovzxbw_avx(auVar20);
          auVar21 = vpslldq_avx(auVar20,2);
          auVar22 = vpshufd_avx(local_68,0xff);
          auVar20 = vpaddd_avx(auVar21,auVar20);
          auVar21 = vpslldq_avx(auVar20,4);
          auVar20 = vpaddd_avx(auVar20,auVar21);
          auVar21 = vpmovzxwd_avx(auVar20);
          local_58 = vpaddd_avx(auVar22,auVar21);
          auVar20 = vpunpckhwd_avx(auVar20,(undefined1  [16])0x0);
          local_68 = vpaddd_avx(local_58,auVar20);
          if (iVar16 + 0x20 <= slot) {
            dataPtr = (uint8_t *)((long)dataPtr + 0x20);
            goto LAB_0014a2a2;
          }
          local_78[0] = local_58;
          local_78[1] = local_68;
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                 local_78[*(int *)(_extract_from_xmm_indices + (long)(int)uVar11 * 4
                                                  )],
                                *(undefined1 (*) [16])
                                 (streamvbyte_shuffle_mask_bytes + ((uVar11 & 3) << 4)));
          uVar6 = auVar20._0_4_;
          bVar5 = false;
          goto LAB_0014a14f;
        }
        local_78[0] = local_58;
        local_78[1] = local_68;
        lVar8 = (long)(slot - (iVar16 + 0x10));
      }
    }
    auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                           local_78[*(int *)(_extract_from_xmm_indices + lVar8 * 4)],
                          *(undefined1 (*) [16])
                           (streamvbyte_shuffle_mask_bytes + (((uint)lVar8 & 3) << 4)));
    uVar6 = auVar20._0_4_;
    bVar5 = false;
  }
  else {
    auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                          *(undefined1 (*) [16])
                           (shuffleTable[0] + (uint)((int)(uVar14 & 0xff) << 4)));
    auVar21 = vpslldq_avx(auVar20,4);
    auVar20 = vpaddd_avx(auVar21,auVar20);
    auVar2._4_4_ = local_68._12_4_;
    auVar2._0_4_ = local_68._12_4_;
    auVar2._8_4_ = local_68._12_4_;
    auVar2._12_4_ = local_68._12_4_;
    auVar21 = vpaddd_avx512vl(auVar20,auVar2);
    auVar20 = vpslldq_avx(auVar20,8);
    local_58 = vpaddd_avx(auVar21,auVar20);
    bVar9 = (byte)(uVar14 >> 8);
    pauVar17 = (undefined1 (*) [16])
               (*(undefined1 (*) [16])dataPtr +
               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [bVar9] +
               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar14 & 0xff]);
    auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                           (*(undefined1 (*) [16])dataPtr +
                           "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar14 & 0xff]),(undefined1  [16])shuffleTable[bVar9]);
    auVar22 = vpslldq_avx(auVar20,4);
    auVar21 = vpshufd_avx(local_58,0xff);
    auVar20 = vpaddd_avx(auVar22,auVar20);
    auVar22 = vpslldq_avx(auVar20,8);
    auVar20 = vpaddd_avx(auVar20,auVar22);
    local_68 = vpaddd_avx(auVar20,auVar21);
    iVar10 = iVar16 + 8;
    if (slot < iVar10) {
      local_78[0] = local_58;
      local_78[1] = local_68;
      auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                             local_78[*(int *)(_extract_from_xmm_indices + (long)(slot - iVar16) * 4
                                              )],
                            *(undefined1 (*) [16])
                             (streamvbyte_shuffle_mask_bytes + ((slot - iVar16 & 3U) << 4)));
      uVar6 = auVar20._0_4_;
      bVar5 = false;
      dataPtr = (uint8_t *)pauVar17;
    }
    else {
      uVar11 = (uint)uVar14 >> 0x10 & 0xff;
      auVar20 = vpshufb_avx(*pauVar17,*(undefined1 (*) [16])(shuffleTable[0] + (uVar11 << 4)));
      auVar22 = vpslldq_avx(auVar20,4);
      auVar21 = vpshufd_avx(local_68,0xff);
      auVar20 = vpaddd_avx(auVar22,auVar20);
      auVar22 = vpslldq_avx(auVar20,8);
      auVar20 = vpaddd_avx(auVar20,auVar22);
      local_58 = vpaddd_avx(auVar20,auVar21);
      uVar12 = uVar14 >> 0x18 & 0xff;
      auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                             (*pauVar17 +
                             "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar11]),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
      dataPtr = *pauVar17 +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar12] +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar11];
      auVar22 = vpslldq_avx(auVar20,4);
      auVar21 = vpshufd_avx(local_58,0xff);
      auVar20 = vpaddd_avx(auVar22,auVar20);
      auVar22 = vpslldq_avx(auVar20,8);
      auVar20 = vpaddd_avx(auVar20,auVar22);
      local_68 = vpaddd_avx(auVar20,auVar21);
      iVar15 = iVar16 + 0x10;
      if (slot < iVar15) {
LAB_00149f4f:
        local_78[0] = local_58;
        local_78[1] = local_68;
        iVar15 = iVar10;
      }
      else {
        uVar12 = uVar14 >> 0x20 & 0xff;
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        auVar22 = vpslldq_avx(auVar20,4);
        auVar21 = vpshufd_avx(local_68,0xff);
        auVar20 = vpaddd_avx(auVar22,auVar20);
        auVar22 = vpslldq_avx(auVar20,8);
        auVar20 = vpaddd_avx(auVar20,auVar22);
        local_58 = vpaddd_avx(auVar20,auVar21);
        uVar13 = uVar14 >> 0x28 & 0xff;
        auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar12]),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar13] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar12];
        auVar22 = vpslldq_avx(auVar20,4);
        auVar21 = vpshufd_avx(local_58,0xff);
        auVar20 = vpaddd_avx(auVar22,auVar20);
        auVar22 = vpslldq_avx(auVar20,8);
        auVar20 = vpaddd_avx(auVar20,auVar22);
        local_68 = vpaddd_avx(auVar20,auVar21);
        iVar10 = iVar16 + 0x18;
        if (iVar10 <= slot) {
          uVar12 = uVar14 >> 0x30 & 0xff;
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
          auVar22 = vpslldq_avx(auVar20,4);
          auVar21 = vpshufd_avx(local_68,0xff);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar20,auVar22);
          local_58 = vpaddd_avx(auVar20,auVar21);
          auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                 [uVar12]),(undefined1  [16])shuffleTable[uVar14 >> 0x38]);
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar14 >> 0x38] +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar12];
          auVar22 = vpslldq_avx(auVar20,4);
          auVar21 = vpshufd_avx(local_58,0xff);
          auVar20 = vpaddd_avx(auVar22,auVar20);
          auVar22 = vpslldq_avx(auVar20,8);
          auVar20 = vpaddd_avx(auVar20,auVar22);
          local_68 = vpaddd_avx(auVar20,auVar21);
          if (iVar16 + 0x20 <= slot) {
LAB_0014a2a2:
            iVar16 = iVar16 + 0x20;
            bVar5 = true;
            prev = local_68._12_4_;
            goto LAB_0014a14f;
          }
          goto LAB_00149f4f;
        }
        local_78[0] = local_58;
        local_78[1] = local_68;
      }
      auVar20 = vpshufb_avx(*(undefined1 (*) [16])
                             local_78[*(int *)(_extract_from_xmm_indices + (long)(slot - iVar15) * 4
                                              )],
                            *(undefined1 (*) [16])
                             (streamvbyte_shuffle_mask_bytes + ((slot - iVar15 & 3U) << 4)));
      uVar6 = auVar20._0_4_;
      bVar5 = false;
    }
  }
LAB_0014a14f:
  if (!bVar5) {
    return uVar6;
  }
LAB_0014a153:
  uVar14 = count >> 2 & 0xfffffffffffffff8;
  uVar6 = svb_select_scalar_d1_init(keyPtr + uVar14,dataPtr,uVar14,prev,slot - iVar16);
  return uVar6;
}

Assistant:

uint32_t svb_select_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                uint64_t count, uint32_t prev, int slot) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  // make sure that the loop is run at least once
  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 8)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 16)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 8));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 24)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 16));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 32)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 24));

      consumedInts += 32;
    }

    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  uint32_t keysleft = count & 31;
  return svb_select_scalar_d1_init(keyPtr + consumedkeys, dataPtr, keysleft,
                                   prev, slot - consumedInts);
}